

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcd.cpp
# Opt level: O3

void __thiscall GPIO::HitachiLCDBase::int_out_nibble(HitachiLCDBase *this,bool data,uchar out)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  size_t __n;
  void *__buf;
  uint uVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  timespec local_30;
  
  puVar2 = GPIOBase::gpio_addr;
  if (this->m_i2c != false) {
    uVar6 = (uint)(byte)(out << 4);
    if (this->m_upper_expander == false) {
      uVar6 = (uint)out;
    }
    __n = 0;
    uVar3 = 0;
    if (data) {
      uVar3 = this->m_rs;
    }
    if (this->m_backlit != this->m_inverted_backlight_toggle) {
      __n = (size_t)this->m_backlight;
    }
    uVar6 = (uVar3 | uVar6 | (uint)__n) & 0xff;
    I2C::write(&this->i2c,this->m_en | uVar6,(void *)(ulong)this->m_backlit,__n);
    I2C::write(&this->i2c,uVar6,__buf,__n);
    return;
  }
  puVar8 = GPIOBase::gpio_addr + 10;
  puVar1 = GPIOBase::gpio_addr + 7;
  puVar7 = puVar8;
  if (data) {
    puVar7 = puVar1;
  }
  puVar7[this->m_rs >> 5] = (long)(1 << ((byte)this->m_rs & 0x1f));
  puVar7 = puVar8;
  if ((out & 1) != 0) {
    puVar7 = puVar1;
  }
  puVar7[this->m_d4 >> 5] = (long)(1 << ((byte)this->m_d4 & 0x1f));
  puVar7 = puVar8;
  if ((out & 2) != 0) {
    puVar7 = puVar1;
  }
  puVar7[this->m_d5 >> 5] = (long)(1 << ((byte)this->m_d5 & 0x1f));
  puVar7 = puVar8;
  if ((out & 4) != 0) {
    puVar7 = puVar1;
  }
  puVar7[this->m_d6 >> 5] = (long)(1 << ((byte)this->m_d6 & 0x1f));
  if ((out & 8) != 0) {
    puVar8 = puVar1;
  }
  puVar8[this->m_d7 >> 5] = (long)(1 << ((byte)this->m_d7 & 0x1f));
  puVar2[(ulong)(this->m_en >> 5) + 7] = (long)(1 << ((byte)this->m_en & 0x1f));
  local_30.tv_sec = 0;
  local_30.tv_nsec = 55000;
  do {
    iVar4 = nanosleep(&local_30,&local_30);
    if (iVar4 != -1) break;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  GPIOBase::gpio_addr[(ulong)(this->m_en >> 5) + 10] = (long)(1 << ((byte)this->m_en & 0x1f));
  local_30.tv_sec = 0;
  local_30.tv_nsec = 55000;
  do {
    iVar4 = nanosleep(&local_30,&local_30);
    if (iVar4 != -1) {
      return;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  return;
}

Assistant:

void HitachiLCDBase::int_out_nibble(bool data, unsigned char out) const
{
    if (!m_i2c) {

        // display directly attached to GPIO

        gpio.write(m_rs, data);
        gpio.write(m_d4, out & 1);
        out >>= 1;
        gpio.write(m_d5, out & 1);
        out >>= 1;
        gpio.write(m_d6, out & 1);
        out >>= 1;
        gpio.write(m_d7, out & 1);

        // send enable (strobe) to display

        gpio.set(m_en);
        std::this_thread::sleep_for(std::chrono::microseconds(55));

        // clear enable (the display takes the data on the falling edge)

        gpio.clear(m_en);
        std::this_thread::sleep_for(std::chrono::microseconds(55));

    } else {

        // display attached on I2C bus

        unsigned char ctrl = out;
        if (m_upper_expander) {
            ctrl <<= 4;
        }
        if (data) ctrl |= m_rs;
        if (m_inverted_backlight_toggle) {
            ctrl |= ((m_backlit) ? 0 : m_backlight);
        } else {
            ctrl |= ((m_backlit) ? m_backlight : 0);
        }

        // send enable (strobe)

        i2c.write(m_en | ctrl);

        // and clear strobe (the display takes the data on the falling edge)

        i2c.write(ctrl);

    }
}